

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

int m256v_row_iszero(m256v *M,int r)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = M->n_col;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (M->e[uVar4 + M->rstride * (long)r] == '\0');
  return (int)((long)(int)uVar1 <= (long)uVar4);
}

Assistant:

int m256v_row_iszero(const m256v* M, int r)
{
	for (int c = 0; c < M->n_col; ++c) {
		if (get_el(M, r, c) != 0) {
			return 0;
		}
	}
	return 1;
}